

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::TexSubImage2DDepthCase::TexSubImage2DDepthCase
          (TexSubImage2DDepthCase *this,Context *context,char *name,char *desc,
          deUint32 internalFormat,int imageWidth,int imageHeight)

{
  TextureFormatInfo *pTVar1;
  uint uVar2;
  uint uVar3;
  TextureFormat local_38;
  
  local_38 = glu::mapGLInternalFormat(internalFormat);
  uVar3 = imageHeight;
  if (imageHeight < imageWidth) {
    uVar3 = imageWidth;
  }
  uVar2 = 0x20;
  if (uVar3 != 0) {
    uVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar2 = uVar2 ^ 0x1f;
  }
  Texture2DSpecCase::Texture2DSpecCase
            (&this->super_Texture2DSpecCase,context,name,desc,&local_38,imageWidth,imageHeight,
             0x20 - uVar2);
  (this->super_Texture2DSpecCase).super_TextureSpecCase.super_TestCase.super_TestCase.super_TestNode
  ._vptr_TestNode = (_func_int **)&PTR__Texture3DSpecCase_02135670;
  *(deUint32 *)&(this->super_Texture2DSpecCase).field_0xd4 = internalFormat;
  (this->super_Texture2DSpecCase).m_texFormatInfo.lookupBias.m_data[0] = 0.25;
  (this->super_Texture2DSpecCase).m_texFormatInfo.lookupBias.m_data[1] = 0.0;
  pTVar1 = &(this->super_Texture2DSpecCase).m_texFormatInfo;
  (pTVar1->lookupBias).m_data[2] = 0.0;
  (pTVar1->lookupBias).m_data[3] = 1.0;
  (this->super_Texture2DSpecCase).m_texFormatInfo.lookupScale.m_data[0] = 0.5;
  (this->super_Texture2DSpecCase).m_texFormatInfo.lookupScale.m_data[1] = 1.0;
  pTVar1 = &(this->super_Texture2DSpecCase).m_texFormatInfo;
  (pTVar1->lookupScale).m_data[2] = 1.0;
  (pTVar1->lookupScale).m_data[3] = 0.0;
  return;
}

Assistant:

TexSubImage2DDepthCase (Context&	context,
							const char*	name,
							const char*	desc,
							deUint32	internalFormat,
							int			imageWidth,
							int			imageHeight)
		: Texture2DSpecCase	(context, name, desc, glu::mapGLInternalFormat(internalFormat), imageWidth, imageHeight, maxLevelCount(imageWidth, imageHeight))
		, m_internalFormat	(internalFormat)
	{
		// we are interested in the behavior near [-2, 2], map it to visible range [0, 1]
		m_texFormatInfo.lookupBias = Vec4(0.25f, 0.0f, 0.0f, 1.0f);
		m_texFormatInfo.lookupScale = Vec4(0.5f, 1.0f, 1.0f, 0.0f);
	}